

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountShader::shadePrimitives
          (VaryingOutputCountShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  float *pfVar1;
  Vec4 *a;
  float fVar2;
  float fVar3;
  int local_210;
  deUint32 local_20c;
  float local_200;
  float local_1f8;
  int local_1f4;
  undefined1 local_1e4 [8];
  GenericVec4 fragColor;
  Vector<float,_4> local_1c4;
  undefined1 local_1b4 [8];
  Vec4 position1;
  Vector<float,_4> local_194;
  undefined1 local_184 [8];
  Vec4 position0;
  Vector<float,_4> local_164;
  undefined1 local_154 [8];
  Vec4 basePosition;
  float angle;
  int ndx;
  Vec4 texColor;
  Vec2 texCoord;
  int primitiveNdx_1;
  undefined1 local_100 [8];
  int primitiveNdx;
  float local_f4 [2];
  Vector<float,_4> local_ec;
  void *local_dc;
  Vec4 color;
  int emitCount;
  VertexPacket *vertex;
  undefined1 local_b8 [4];
  int packetNdx;
  Vec4 colors [4];
  undefined1 local_70 [8];
  Vec4 yellow;
  Vec4 blue;
  Vec4 green;
  Vec4 red;
  int invocationID_local;
  int numPackets_local;
  PrimitivePacket *packets_local;
  int verticesIn_local;
  GeometryEmitter *output_local;
  VaryingOutputCountShader *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(blue.m_data + 2),0.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(yellow.m_data + 2),0.0,0.0,1.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_70,1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_b8,(Vector<float,_4> *)(green.m_data + 2))
  ;
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[0].m_data + 2),(Vector<float,_4> *)(blue.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[1].m_data + 2),(Vector<float,_4> *)(yellow.m_data + 2));
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colors[2].m_data + 2),(Vector<float,_4> *)local_70);
  for (vertex._4_4_ = 0; vertex._4_4_ < numPackets; vertex._4_4_ = vertex._4_4_ + 1) {
    unique0x00012000 = packets[vertex._4_4_].vertices[0];
    color.m_data[2] = 0.0;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_dc,0.0,0.0,0.0,0.0);
    if (*(int *)&(this->super_ShaderProgram).field_0x154 == 0) {
      rr::GenericVec4::get<float>((GenericVec4 *)&local_ec);
      local_1f4 = invocationID;
      if ((this->m_instanced & 1U) == 0) {
        local_1f4 = 0;
      }
      pfVar1 = tcu::Vector<float,_4>::operator[](&local_ec,local_1f4);
      color.m_data[2] = (float)(int)*pfVar1;
      local_1f8 = 0.0;
      if (9 < (int)color.m_data[2]) {
        local_1f8 = 1.0;
      }
      local_200 = 0.0;
      if ((int)color.m_data[2] < 0xb) {
        local_200 = 1.0;
      }
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(local_100 + 4),local_1f8,local_200,1.0,1.0)
      ;
      local_dc = (void *)stack0xffffffffffffff04;
      color.m_data[0] = local_f4[0];
      color.m_data[1] = local_f4[1];
    }
    else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 1) {
      local_20c = invocationID;
      if ((this->m_instanced & 1U) == 0) {
        rr::GenericVec4::get<float>((GenericVec4 *)&stack0xfffffffffffffef0);
        pfVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&stack0xfffffffffffffef0);
        local_20c = (deUint32)*pfVar1;
      }
      local_100._0_4_ = local_20c;
      color.m_data[2] = *(float *)((long)&this->m_emitCount->value + (long)(int)local_20c * 4);
      local_dc = *(void **)(local_b8 + (long)(int)local_20c * 0x10);
      color.m_data._0_8_ = *(undefined8 *)colors[(int)local_20c].m_data;
    }
    else if (*(int *)&(this->super_ShaderProgram).field_0x154 == 2) {
      local_210 = invocationID;
      if ((this->m_instanced & 1U) == 0) {
        rr::GenericVec4::get<float>((GenericVec4 *)&texCoord);
        pfVar1 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&texCoord);
        local_210 = (int)*pfVar1;
      }
      tcu::Vector<float,_2>::Vector
                ((Vector<float,_2> *)(texColor.m_data + 2),(float)local_210 / 4.0 + 0.125,0.5);
      fVar2 = tcu::Vector<float,_2>::x((Vector<float,_2> *)(texColor.m_data + 2));
      fVar3 = tcu::Vector<float,_2>::y((Vector<float,_2> *)(texColor.m_data + 2));
      sglr::rc::Texture2D::sample((Texture2D *)&angle,fVar2,fVar3,0.0);
      local_dc = *(void **)(local_b8 + (long)local_210 * 0x10);
      color.m_data._0_8_ = *(undefined8 *)colors[local_210].m_data;
      color.m_data[2] = 0.0;
      fVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)&angle);
      if (0.0 < fVar2) {
        color.m_data[2] = (float)((int)color.m_data[2] + 6);
      }
      tcu::Vector<float,_4>::y((Vector<float,_4> *)&angle);
      fVar2 = tcu::Vector<float,_4>::z((Vector<float,_4> *)&angle);
      if (0.0 < fVar2) {
        color.m_data[2] = (float)(this->m_maxEmitCount + (int)color.m_data[2]);
      }
      fVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)&angle);
      if (0.0 < fVar2) {
        color.m_data[2] = (float)((int)color.m_data[2] + 10);
      }
    }
    for (basePosition.m_data[3] = 0.0; (int)basePosition.m_data[3] < (int)color.m_data[2] / 2;
        basePosition.m_data[3] = (float)((int)basePosition.m_data[3] + 1)) {
      basePosition.m_data[2] =
           (((float)(int)basePosition.m_data[3] + 0.5) / (float)((int)color.m_data[2] / 2)) * 3.142;
      if ((this->m_instanced & 1U) == 0) {
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)local_154,&stack0xffffffffffffff38->position);
      }
      else {
        a = &stack0xffffffffffffff38->position;
        fVar2 = ::deFloatCos((float)invocationID);
        fVar3 = ::deFloatSin((float)invocationID);
        tcu::Vector<float,_4>::Vector
                  ((Vector<float,_4> *)(position0.m_data + 2),fVar2,fVar3,0.0,0.0);
        tcu::operator*((tcu *)&local_164,(Vector<float,_4> *)(position0.m_data + 2),0.5);
        tcu::operator+((tcu *)local_154,a,&local_164);
      }
      fVar2 = ::deFloatCos(basePosition.m_data[2]);
      fVar3 = ::deFloatSin(basePosition.m_data[2]);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(position1.m_data + 2),fVar2,fVar3,0.0,0.0);
      tcu::operator*((tcu *)&local_194,(Vector<float,_4> *)(position1.m_data + 2),0.15);
      tcu::operator+((tcu *)local_184,(Vector<float,_4> *)local_154,&local_194);
      fVar2 = ::deFloatCos(basePosition.m_data[2]);
      fVar3 = ::deFloatSin(basePosition.m_data[2]);
      tcu::Vector<float,_4>::Vector
                ((Vector<float,_4> *)((long)&fragColor.v + 8),fVar2,-fVar3,0.0,0.0);
      tcu::operator*((tcu *)&local_1c4,(Vector<float,_4> *)((long)&fragColor.v + 8),0.15);
      tcu::operator+((tcu *)local_1b4,(Vector<float,_4> *)local_154,&local_1c4);
      rr::GenericVec4::GenericVec4((GenericVec4 *)local_1e4);
      rr::GenericVec4::operator=((GenericVec4 *)local_1e4,(Vector<float,_4> *)&local_dc);
      rr::GeometryEmitter::EmitVertex
                (output,(Vec4 *)local_184,0.0,(GenericVec4 *)local_1e4,
                 packets[vertex._4_4_].primitiveIDIn);
      rr::GeometryEmitter::EmitVertex
                (output,(Vec4 *)local_1b4,0.0,(GenericVec4 *)local_1e4,
                 packets[vertex._4_4_].primitiveIDIn);
    }
    rr::GeometryEmitter::EndPrimitive(output);
  }
  return;
}

Assistant:

void VaryingOutputCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { red, green, blue, yellow };

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];
		int						emitCount	= 0;
		tcu::Vec4				color		= tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);

		if (m_test == READ_ATTRIBUTE)
		{
			emitCount = (int)vertex->outputs[0].get<float>()[(m_instanced) ? (invocationID) : (0)];
			color = tcu::Vec4((emitCount < 10) ? (0.0f) : (1.0f), (emitCount > 10) ? (0.0f) : (1.0f), 1.0f, 1.0f);
		}
		else if (m_test == READ_UNIFORM)
		{
			const int primitiveNdx = (m_instanced) ? (invocationID) : ((int)vertex->outputs[0].get<float>().x());

			DE_ASSERT(primitiveNdx >= 0);
			DE_ASSERT(primitiveNdx < 4);

			emitCount = m_emitCount.value.i4[primitiveNdx];
			color = colors[primitiveNdx];
		}
		else if (m_test == READ_TEXTURE)
		{
			const int			primitiveNdx	= (m_instanced) ? (invocationID) : ((int)vertex->outputs[0].get<float>().x());
			const tcu::Vec2		texCoord		= tcu::Vec2(1.0f / 8.0f + (float)primitiveNdx / 4.0f, 0.5f);
			const tcu::Vec4		texColor		= m_sampler.sampler.tex2D->sample(texCoord.x(), texCoord.y(), 0.0f);

			DE_ASSERT(primitiveNdx >= 0);
			DE_ASSERT(primitiveNdx < 4);

			color = colors[primitiveNdx];
			emitCount = 0;

			if (texColor.x() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_0 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_0);
			if (texColor.y() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_1 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_1);
			if (texColor.z() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_2 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_2);
			if (texColor.w() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_3 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_3);
		}
		else
			DE_ASSERT(DE_FALSE);

		for (int ndx = 0; ndx < (int)emitCount / 2; ++ndx)
		{
			const float		angle			= (float(ndx) + 0.5f) / float(emitCount / 2) * 3.142f;
			const tcu::Vec4 basePosition	= (m_instanced) ?
												(vertex->position + tcu::Vec4(deFloatCos(float(invocationID)), deFloatSin(float(invocationID)), 0.0f, 0.0f) * 0.5f) :
												(vertex->position);
			const tcu::Vec4	position0		= basePosition + tcu::Vec4(deFloatCos(angle),  deFloatSin(angle), 0.0f, 0.0f) * 0.15f;
			const tcu::Vec4	position1		= basePosition + tcu::Vec4(deFloatCos(angle), -deFloatSin(angle), 0.0f, 0.0f) * 0.15f;
			rr::GenericVec4	fragColor;

			fragColor = color;

			output.EmitVertex(position0, 0.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position1, 0.0f, &fragColor, packets[packetNdx].primitiveIDIn);
		}

		output.EndPrimitive();
	}
}